

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_ieee754_sqrt(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_1a0;
  operation local_19c;
  operand local_198 [2];
  operation local_190 [2];
  operand local_188 [2];
  operation local_180;
  operand local_17c [3];
  operation local_170;
  operand local_16c [2];
  operation local_164;
  operand local_160 [2];
  operation local_158 [2];
  operand local_150 [2];
  operation local_148;
  operand local_144 [2];
  operation local_13c;
  uint64_t local_138;
  uint64_t header;
  operand local_128;
  operation local_124 [2];
  operand local_11c [2];
  operation local_114 [2];
  operand local_10c [2];
  operation local_104 [4];
  operand local_f4 [2];
  operation local_ec;
  unsigned_long local_e8;
  operand local_dc [2];
  operation local_d4 [3];
  operand local_c8 [2];
  operation local_c0 [3];
  operand local_b4 [2];
  operation local_ac;
  string local_a8;
  undefined1 local_88 [8];
  string save_flonum;
  undefined1 local_58 [8];
  string is_fixnum;
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  std::__cxx11::string::string((string *)(is_fixnum.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_88,psVar1,lab_00);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_a8,psVar1,lab_01);
    std::__cxx11::string::operator=
              ((string *)(is_fixnum.field_2._M_local_buf + 8),(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_ac = CMP;
    local_b4[1] = 0x14;
    local_b4[0] = NUMBER;
    local_c0[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_ac,local_b4 + 1,local_b4,(int *)(local_c0 + 2));
    local_c0[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_c0 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&is_fixnum.field_2 + 8));
  }
  local_c0[0] = TEST;
  local_c8[1] = 0xb;
  local_c8[0] = NUMBER;
  local_d4[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_c0,local_c8 + 1,local_c8,(int *)(local_d4 + 2));
  local_d4[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_d4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_short_if_arg_is_not_block(code,RCX,R11,(string *)((long)&is_fixnum.field_2 + 8));
  }
  local_d4[0] = AND;
  local_dc[1] = 0xb;
  local_dc[0] = NUMBER;
  local_e8 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_d4,local_dc + 1,local_dc,&local_e8);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_short_if_arg_does_not_point_to_flonum
              (code,RCX,R11,(string *)((long)&is_fixnum.field_2 + 8));
  }
  local_ec = MOVQ;
  local_f4[1] = 0x43;
  local_f4[0] = MEM_RCX;
  local_104[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_ec,local_f4 + 1,local_f4,(int *)(local_104 + 3));
  local_104[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_104 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  local_104[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_104 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_104[0] = SAR;
  local_10c[1] = 0xb;
  local_10c[0] = NUMBER;
  local_114[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_104,local_10c + 1,local_10c,(int *)(local_114 + 1));
  local_114[0] = CVTSI2SD;
  local_11c[1] = 0x43;
  local_11c[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_114,local_11c + 1,local_11c);
  local_124[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_124 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  local_124[0] = SQRTPD;
  local_128 = XMM0;
  header._4_4_ = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_124,&local_128,(operand *)((long)&header + 4));
  local_138 = make_block_header(1,T_FLONUM);
  local_13c = MOV;
  local_144[1] = 0x14;
  local_144[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_13c,local_144 + 1,local_144);
  local_148 = OR;
  local_150[1] = 0x14;
  local_150[0] = NUMBER;
  local_158[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_148,local_150 + 1,local_150,(int *)(local_158 + 1));
  local_158[0] = MOV;
  local_160[1] = 9;
  local_160[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,local_158,local_160 + 1,local_160,&local_138);
  local_164 = MOV;
  local_16c[1] = 0x20;
  local_16c[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_164,local_16c + 1,local_16c);
  local_170 = MOVQ;
  local_17c[2] = 0x20;
  local_17c[1] = 8;
  local_17c[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_170,local_17c + 2,(int *)(local_17c + 1),local_17c);
  local_180 = ADD;
  local_188[1] = 0x10;
  local_188[0] = NUMBER;
  local_190[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_180,local_188 + 1,local_188,(int *)(local_190 + 1));
  local_190[0] = MOV;
  local_198[1] = 9;
  local_198[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_190,local_198 + 1,local_198);
  local_19c = JMP;
  local_1a0 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_19c,&local_1a0);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)((long)&is_fixnum.field_2 + 8),re_ieee754_sqrt_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(is_fixnum.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_ieee754_sqrt(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string is_fixnum = label_to_string(label++);
  std::string save_flonum = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, is_fixnum);
  if (ops.safe_primitives)
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);

  code.add(asmcode::MOVQ, asmcode::XMM0, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::JMPS, save_flonum);
  code.add(asmcode::LABEL, is_fixnum);
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::CVTSI2SD, asmcode::XMM0, asmcode::RCX);
  code.add(asmcode::LABEL, save_flonum);
  code.add(asmcode::SQRTPD, asmcode::XMM0, asmcode::XMM0);
  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(asmcode::MOV, asmcode::R11, ALLOC);
  code.add(asmcode::OR, asmcode::R11, asmcode::NUMBER, block_tag);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM0);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_ieee754_sqrt_contract_violation);
    }
  }